

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

size_t __thiscall
proto2_unittest::TestMessageWithCustomOptions::ByteSizeLong(TestMessageWithCustomOptions *this)

{
  MapField<proto2_unittest::TestMessageWithCustomOptions_MapFieldEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *this_00;
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  long *plVar6;
  size_t sVar7;
  
  this_00 = &(this->field_0)._impl_.map_field_;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
  sVar7 = (size_t)*(uint *)((long)&this->field_0 + 0x18);
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
  uVar3 = *(uint *)((long)&this->field_0 + 0x20);
  uVar5 = (ulong)uVar3;
  if (uVar3 == *(uint *)((long)&this->field_0 + 0x1c)) {
    uVar5 = 0;
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_field_.
                                         super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .field_0 + 0x10) + uVar5 * 8);
    if (plVar6 == (long *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  do {
    if (plVar6 == (long *)0x0) {
      if ((undefined1  [72])((undefined1  [72])this->field_0 & (undefined1  [72])0x1) !=
          (undefined1  [72])0x0) {
        lVar1 = *(long *)(((ulong)(this->field_0)._impl_.field1_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc) + 8);
        uVar3 = (uint)lVar1 | 1;
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        sVar7 = sVar7 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
      }
      if ((this->field_0)._impl_._oneof_case_[0] == 2) {
        uVar5 = (long)(this->field_0)._impl_.AnOneof_.oneof_field_ | 1;
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        sVar7 = sVar7 + ((int)lVar1 * 9 + 0x89U >> 6);
      }
      sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                        (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
      return sVar7;
    }
    sVar4 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar6 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar6 + 5));
    plVar6 = (long *)*plVar6;
    if (plVar6 == (long *)0x0) {
      do {
        uVar3 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar3;
        if (*(uint *)((long)&this->field_0 + 0x1c) <= uVar3) {
          plVar6 = (long *)0x0;
          uVar5 = 0;
          break;
        }
        plVar6 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_field_.
                                             super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             .field_0 + 0x10) + (ulong)uVar3 * 8);
      } while (plVar6 == (long *)0x0);
    }
    sVar7 = sVar7 + sVar4;
  } while( true );
}

Assistant:

::size_t TestMessageWithCustomOptions::ByteSizeLong() const {
  const TestMessageWithCustomOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMessageWithCustomOptions)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<string, string> map_field = 3 [(.proto2_unittest.field_opt1) = 12345];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_field_size());
      for (const auto& entry : this_._internal_map_field()) {
        total_size += _pbi::MapEntryFuncs<std::string, std::string,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_STRING>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
   {
    // optional string field1 = 1 [ctype = CORD, (.proto2_unittest.field_opt1) = 8765432109];
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_field1());
    }
  }
  switch (this_.AnOneof_case()) {
    // int32 oneof_field = 2;
    case kOneofField: {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_oneof_field());
      break;
    }
    case ANONEOF_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}